

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,
                         uint nbSamples,uint d,double splitPoint,uint f,
                         FASTCOVER_accel_t accelParams)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t *psVar4;
  U32 *pUVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  U32 local_58;
  uint local_54;
  ulong local_50;
  
  uVar12 = (ulong)nbSamples;
  sVar1 = COVER_sum(samplesSizes,nbSamples);
  uVar11 = (ulong)((double)uVar12 * splitPoint);
  uVar10 = 0;
  if (splitPoint < 1.0) {
    uVar10 = (uint)uVar11;
  }
  uVar6 = nbSamples - uVar10;
  uVar8 = uVar12;
  sVar2 = sVar1;
  sVar3 = sVar1;
  if (splitPoint < 1.0) {
    sVar2 = COVER_sum(samplesSizes,(uint)uVar11);
    sVar3 = COVER_sum(samplesSizes + (uVar11 & 0xffffffff),uVar6);
    uVar8 = uVar11 & 0xffffffff;
  }
  uVar11 = 8;
  if (8 < d) {
    uVar11 = (ulong)d;
  }
  if (sVar1 < uVar11 || 0xfffffffe < sVar1) {
    if (g_displayLevel < 1) {
      return 0xffffffffffffffb8;
    }
    fprintf(_stderr,"Total samples size is too large (%u MB), maximum size is %u MB\n",
            sVar1 >> 0x14 & 0xffffffff,0xfff);
  }
  else {
    if ((uint)uVar8 < 5) {
      if (g_displayLevel < 1) {
        return 0xffffffffffffffb8;
      }
      pcVar9 = "Total number of training samples is %u and is invalid\n";
    }
    else {
      if (nbSamples != uVar10) {
        ctx->d = 0;
        ctx->f = 0;
        (ctx->accelParams).finalize = 0;
        (ctx->accelParams).skip = 0;
        ctx->nbDmers = 0;
        ctx->freqs = (U32 *)0x0;
        ctx->nbTrainSamples = 0;
        ctx->nbTestSamples = 0;
        ctx->samplesSizes = (size_t *)0x0;
        ctx->nbSamples = 0;
        ctx->samples = (BYTE *)0x0;
        ctx->offsets = (size_t *)0x0;
        if (1 < g_displayLevel) {
          fprintf(_stderr,"Training on %u samples of total size %u\n",uVar8,sVar2 & 0xffffffff);
          fflush(_stderr);
          if (1 < g_displayLevel) {
            fprintf(_stderr,"Testing on %u samples of total size %u\n",(ulong)uVar6,sVar3);
            fflush(_stderr);
          }
        }
        ctx->samples = (BYTE *)samplesBuffer;
        ctx->samplesSizes = samplesSizes;
        ctx->nbSamples = uVar12;
        ctx->nbTrainSamples = uVar8;
        ctx->nbTestSamples = (ulong)uVar6;
        ctx->nbDmers = (sVar2 - uVar11) + 1;
        ctx->d = d;
        ctx->f = f;
        ctx->accelParams = accelParams;
        psVar4 = (size_t *)calloc((ulong)(nbSamples + 1),8);
        ctx->offsets = psVar4;
        if (psVar4 == (size_t *)0x0) {
          if (g_displayLevel < 1) goto LAB_0017c3d6;
          pcVar9 = "Failed to allocate scratch buffers \n";
        }
        else {
          if (nbSamples < 5) {
            __assert_fail("nbSamples >= 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xbdae,
                          "size_t FASTCOVER_ctx_init(FASTCOVER_ctx_t *, const void *, const size_t *, unsigned int, unsigned int, double, unsigned int, FASTCOVER_accel_t)"
                         );
          }
          uVar10 = accelParams.skip;
          sVar1 = 0;
          for (uVar7 = 1; uVar7 <= uVar12; uVar7 = uVar7 + 1) {
            sVar1 = sVar1 + samplesSizes[uVar7 - 1];
            psVar4[uVar7] = sVar1;
          }
          pUVar5 = (U32 *)calloc(1L << ((byte)f & 0x3f),4);
          ctx->freqs = pUVar5;
          if (pUVar5 != (U32 *)0x0) {
            local_58 = f;
            local_54 = d;
            if (1 < g_displayLevel) {
              fwrite("Computing frequencies\n",0x16,1,_stderr);
              fflush(_stderr);
              uVar8 = ctx->nbTrainSamples;
              pUVar5 = ctx->freqs;
              local_58 = ctx->f;
              local_54 = ctx->d;
              uVar10 = (ctx->accelParams).skip;
              uVar6 = 8;
              if (8 < local_54) {
                uVar6 = local_54;
              }
              uVar11 = (ulong)uVar6;
            }
            if (4 < uVar8) {
              if (uVar8 <= ctx->nbSamples) {
                local_50 = 0;
                while (local_50 < uVar8) {
                  psVar4 = ctx->offsets + local_50;
                  uVar12 = ctx->offsets[local_50 + 1];
                  local_50 = local_50 + 1;
                  for (sVar1 = *psVar4; sVar1 + uVar11 <= uVar12; sVar1 = sVar1 + (ulong)uVar10 + 1)
                  {
                    sVar2 = FASTCOVER_hashPtrToIndex(ctx->samples + sVar1,local_58,local_54);
                    pUVar5[sVar2] = pUVar5[sVar2] + 1;
                  }
                  uVar8 = ctx->nbTrainSamples;
                }
                return 0;
              }
              __assert_fail("ctx->nbTrainSamples <= ctx->nbSamples",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xbd5b,
                            "void FASTCOVER_computeFrequency(U32 *, const FASTCOVER_ctx_t *)");
            }
            __assert_fail("ctx->nbTrainSamples >= 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xbd5a,"void FASTCOVER_computeFrequency(U32 *, const FASTCOVER_ctx_t *)")
            ;
          }
          if (g_displayLevel < 1) goto LAB_0017c3d6;
          pcVar9 = "Failed to allocate frequency table \n";
        }
        fwrite(pcVar9,0x24,1,_stderr);
        fflush(_stderr);
LAB_0017c3d6:
        FASTCOVER_ctx_destroy(ctx);
        return 0xffffffffffffffc0;
      }
      if (g_displayLevel < 1) {
        return 0xffffffffffffffb8;
      }
      pcVar9 = "Total number of testing samples is %u and is invalid.\n";
      uVar8 = 0;
    }
    fprintf(_stderr,pcVar9,uVar8);
  }
  fflush(_stderr);
  return 0xffffffffffffffb8;
}

Assistant:

static size_t
FASTCOVER_ctx_init(FASTCOVER_ctx_t* ctx,
                   const void* samplesBuffer,
                   const size_t* samplesSizes, unsigned nbSamples,
                   unsigned d, double splitPoint, unsigned f,
                   FASTCOVER_accel_t accelParams)
{
    const BYTE* const samples = (const BYTE*)samplesBuffer;
    const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
    /* Split samples into testing and training sets */
    const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
    const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
    const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
    const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;

    /* Checks */
    if (totalSamplesSize < MAX(d, sizeof(U64)) ||
        totalSamplesSize >= (size_t)FASTCOVER_MAX_SAMPLES_SIZE) {
        DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                    (unsigned)(totalSamplesSize >> 20), (FASTCOVER_MAX_SAMPLES_SIZE >> 20));
        return ERROR(srcSize_wrong);
    }

    /* Check if there are at least 5 training samples */
    if (nbTrainSamples < 5) {
        DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid\n", nbTrainSamples);
        return ERROR(srcSize_wrong);
    }

    /* Check if there's testing sample */
    if (nbTestSamples < 1) {
        DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.\n", nbTestSamples);
        return ERROR(srcSize_wrong);
    }

    /* Zero the context */
    memset(ctx, 0, sizeof(*ctx));
    DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
                    (unsigned)trainingSamplesSize);
    DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
                    (unsigned)testSamplesSize);

    ctx->samples = samples;
    ctx->samplesSizes = samplesSizes;
    ctx->nbSamples = nbSamples;
    ctx->nbTrainSamples = nbTrainSamples;
    ctx->nbTestSamples = nbTestSamples;
    ctx->nbDmers = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
    ctx->d = d;
    ctx->f = f;
    ctx->accelParams = accelParams;

    /* The offsets of each file */
    ctx->offsets = (size_t*)calloc((nbSamples + 1), sizeof(size_t));
    if (ctx->offsets == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate scratch buffers \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    /* Fill offsets from the samplesSizes */
    {   U32 i;
        ctx->offsets[0] = 0;
        assert(nbSamples >= 5);
        for (i = 1; i <= nbSamples; ++i) {
            ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
        }
    }

    /* Initialize frequency array of size 2^f */
    ctx->freqs = (U32*)calloc(((U64)1 << f), sizeof(U32));
    if (ctx->freqs == NULL) {
        DISPLAYLEVEL(1, "Failed to allocate frequency table \n");
        FASTCOVER_ctx_destroy(ctx);
        return ERROR(memory_allocation);
    }

    DISPLAYLEVEL(2, "Computing frequencies\n");
    FASTCOVER_computeFrequency(ctx->freqs, ctx);

    return 0;
}